

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

Segment * randomReflection(Segment *__return_storage_ptr__,Segment *segment,Plane *plane)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  int iVar15;
  int iVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  
  uVar8 = (segment->a).x;
  uVar10 = (segment->a).y;
  fVar1 = (segment->a).z;
  fVar2 = (segment->b).x;
  fVar3 = (segment->b).y;
  fVar4 = (segment->b).z;
  fVar5 = (plane->normal).x;
  fVar6 = (plane->normal).y;
  fVar7 = (plane->normal).z;
  iVar15 = rand();
  iVar16 = rand();
  fVar17 = (float)iVar16 * 4.656613e-10 + (float)iVar16 * 4.656613e-10 + -1.0;
  dVar12 = 1.0 - (double)(fVar17 * fVar17);
  if (dVar12 < 0.0) {
    dVar12 = sqrt(dVar12);
  }
  else {
    dVar12 = SQRT(dVar12);
  }
  dVar13 = (double)((float)iVar15 * 4.656613e-10 * 6.2831855 + 0.0);
  dVar14 = sin(dVar13);
  fVar18 = (float)(dVar14 * (double)(float)dVar12);
  dVar13 = cos(dVar13);
  fVar19 = (float)(dVar13 * (double)(float)dVar12);
  if ((fVar7 * fVar17 + fVar5 * fVar18 + fVar6 * fVar19) *
      ((fVar1 - fVar4) * fVar7 + ((float)uVar8 - fVar2) * fVar5 + ((float)uVar10 - fVar3) * fVar6) <
      0.0) {
    fVar18 = -fVar18;
    fVar19 = -fVar19;
    fVar17 = -fVar17;
  }
  (__return_storage_ptr__->a).z = (segment->b).z;
  fVar1 = (segment->b).y;
  (__return_storage_ptr__->a).x = (segment->b).x;
  (__return_storage_ptr__->a).y = fVar1;
  uVar9 = (segment->b).x;
  uVar11 = (segment->b).y;
  fVar1 = (segment->b).z;
  (__return_storage_ptr__->b).x = (float)uVar9 + fVar18;
  (__return_storage_ptr__->b).y = (float)uVar11 + fVar19;
  (__return_storage_ptr__->b).z = fVar17 + fVar1;
  return __return_storage_ptr__;
}

Assistant:

Segment randomReflection(Segment const& segment, Plane const& plane)
{
  Vector ri = segment.a - segment.b;

  Vector N = plane.normal;

  float alpha = randFloat(0.0, M_PI*2);
  float u = randFloat(-1.0, 1.0);
  float s = std::sqrt(1.0-u*u);
  Vector v = {static_cast<float>(sin(alpha)*s), static_cast<float>(cos(alpha)*s), u};
  if (dotProduct(ri, N)*dotProduct(v, N)<0)
  {
    v = v*(-1.0);
  }
  return {segment.b, segment.b + v};
}